

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O0

JsErrorCode JsBooleanToBool(JsValueRef value,bool *boolValue)

{
  bool bVar1;
  BOOL BVar2;
  JavascriptBoolean *this;
  DebugCheckNoException local_28;
  DebugCheckNoException __debugCheckNoException;
  bool *boolValue_local;
  JsValueRef value_local;
  
  if (value == (JsValueRef)0x0) {
    value_local._4_4_ = JsErrorInvalidArgument;
  }
  else if (boolValue == (bool *)0x0) {
    value_local._4_4_ = JsErrorNullArgument;
  }
  else {
    __debugCheckNoException = (DebugCheckNoException)boolValue;
    DebugCheckNoException::DebugCheckNoException(&local_28);
    bVar1 = Js::VarIs<Js::JavascriptBoolean>(value);
    if (bVar1) {
      this = Js::VarTo<Js::JavascriptBoolean>(value);
      BVar2 = Js::JavascriptBoolean::GetValue(this);
      *(byte *)__debugCheckNoException = -(BVar2 != 0) & 1;
    }
    else {
      value_local._4_4_ = JsErrorInvalidArgument;
    }
    local_28.hasException = false;
    DebugCheckNoException::~DebugCheckNoException(&local_28);
    if (bVar1) {
      value_local._4_4_ = JsNoError;
    }
  }
  return value_local._4_4_;
}

Assistant:

CHAKRA_API JsBooleanToBool(_In_ JsValueRef value, _Out_ bool *boolValue)
{
    VALIDATE_JSREF(value);
    PARAM_NOT_NULL(boolValue);

    BEGIN_JSRT_NO_EXCEPTION
    {
        if (!Js::VarIs<Js::JavascriptBoolean>(value))
        {
            RETURN_NO_EXCEPTION(JsErrorInvalidArgument);
        }

        *boolValue = Js::VarTo<Js::JavascriptBoolean>(value)->GetValue() ? true : false;
    }